

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O0

uint __thiscall
RigidBodyDynamics::InverseKinematicsConstraintSet::AddPointConstraintZ
          (InverseKinematicsConstraintSet *this,uint body_id,Vector3d *body_point,
          Vector3d *target_pos,float weight)

{
  size_type sVar1;
  value_type *in_RDI;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_ffffffffffffff68;
  vector<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
  *in_stack_ffffffffffffff70;
  Matrix3_t *this_00;
  vector<Vector3_t,_std::allocator<Vector3_t>_> *in_stack_ffffffffffffff80;
  
  std::
  vector<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
  ::push_back(in_stack_ffffffffffffff70,(value_type *)in_stack_ffffffffffffff68);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff80,
             (value_type_conflict *)in_RDI);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::push_back(in_stack_ffffffffffffff80,in_RDI);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::push_back(in_stack_ffffffffffffff80,in_RDI);
  this_00 = (Matrix3_t *)(in_RDI + 9);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Matrix3_t::
  Matrix3_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            (this_00,in_stack_ffffffffffffff68);
  std::vector<Matrix3_t,_std::allocator<Matrix3_t>_>::push_back
            ((vector<Matrix3_t,_std::allocator<Matrix3_t>_> *)this_00,
             (value_type *)in_stack_ffffffffffffff68);
  std::vector<float,_std::allocator<float>_>::push_back
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff80,
             (value_type_conflict3 *)in_RDI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff80,
             (value_type_conflict *)in_RDI);
  *(int *)(in_RDI[2].super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array + 2) =
       *(int *)(in_RDI[2].super_Vector3d.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               + 2) + 1;
  sVar1 = std::
          vector<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
          ::size((vector<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
                  *)(in_RDI + 5));
  return (int)sVar1 - 1;
}

Assistant:

unsigned int InverseKinematicsConstraintSet::AddPointConstraintZ(
    unsigned int body_id,
    const Vector3d& body_point,
    const Vector3d& target_pos,
    float weight
    ) {
  constraint_type.push_back (ConstraintTypePositionZ);
  body_ids.push_back(body_id);
  body_points.push_back(body_point);
  target_positions.push_back(target_pos);
  target_orientations.push_back(Matrix3d::Zero());
  constraint_weight.push_back(weight);
  constraint_row_index.push_back(num_constraints);
  num_constraints = num_constraints + 1;
  return constraint_type.size() - 1;
}